

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPPacketBuilder::Init
          (RTCPPacketBuilder *this,size_t maxpacksize,double tsunit,void *cname,size_t cnamelen)

{
  RTPTime local_48;
  int local_3c;
  size_t sStack_38;
  int status;
  size_t cnamelen_local;
  void *cname_local;
  double tsunit_local;
  size_t maxpacksize_local;
  RTCPPacketBuilder *this_local;
  
  if ((this->init & 1U) == 0) {
    if (maxpacksize < 600) {
      this_local._4_4_ = -0x30;
    }
    else if (0.0 <= tsunit) {
      sStack_38 = cnamelen;
      if (0xff < cnamelen) {
        sStack_38 = 0xff;
      }
      this->maxpacketsize = maxpacksize;
      this->timestampunit = tsunit;
      cnamelen_local = (size_t)cname;
      cname_local = (void *)tsunit;
      tsunit_local = (double)maxpacksize;
      maxpacksize_local = (size_t)this;
      local_3c = RTCPSDESInfo::SetCNAME
                           (&(this->ownsdesinfo).super_RTCPSDESInfo,(uint8_t *)cname,sStack_38);
      this_local._4_4_ = local_3c;
      if (-1 < local_3c) {
        ClearAllSourceFlags(this);
        this->interval_name = -1;
        this->interval_email = -1;
        this->interval_location = -1;
        this->interval_phone = -1;
        this->interval_tool = -1;
        this->interval_note = -1;
        this->sdesbuildcount = 0;
        RTPTime::RTPTime(&local_48,0,0);
        (this->transmissiondelay).m_t = local_48.m_t;
        this->firstpacket = true;
        this->processingsdes = false;
        this->init = true;
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -0x31;
    }
  }
  else {
    this_local._4_4_ = -0x2f;
  }
  return this_local._4_4_;
}

Assistant:

int RTCPPacketBuilder::Init(size_t maxpacksize,double tsunit,const void *cname,size_t cnamelen)
{
	if (init)
		return ERR_RTP_RTCPPACKETBUILDER_ALREADYINIT;
	if (maxpacksize < RTP_MINPACKETSIZE)
		return ERR_RTP_RTCPPACKETBUILDER_ILLEGALMAXPACKSIZE;
	if (tsunit < 0.0)
		return ERR_RTP_RTCPPACKETBUILDER_ILLEGALTIMESTAMPUNIT;

	if (cnamelen>255)
		cnamelen = 255;
	
	maxpacketsize = maxpacksize;
	timestampunit = tsunit;
	
	int status;
	
	if ((status = ownsdesinfo.SetCNAME((const uint8_t *)cname,cnamelen)) < 0)
		return status;
	
	ClearAllSourceFlags();
	
	interval_name = -1;
	interval_email = -1;
	interval_location = -1;
	interval_phone = -1;
	interval_tool = -1;
	interval_note = -1;

	sdesbuildcount = 0;
	transmissiondelay = RTPTime(0,0);

	firstpacket = true;
	processingsdes = false;
	init = true;
	return 0;
}